

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O1

void anon_unknown.dwarf_3e821::writeModule(Module *wasm,string *filename,WasmSplitOptions *options)

{
  size_type *psVar1;
  size_type *psVar2;
  size_type *psVar3;
  pointer pcVar4;
  undefined1 local_c8 [8];
  ModuleWriter writer;
  long local_40 [2];
  
  writer._0_8_ = &(options->super_ToolOptions).passOptions;
  psVar3 = &writer.symbolMap._M_string_length;
  writer.symbolMap._M_dataplus._M_p = (pointer)0x0;
  writer.symbolMap._M_string_length._0_1_ = 0;
  psVar1 = &writer.sourceMapFilename._M_string_length;
  writer.sourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  writer.sourceMapFilename._M_string_length._0_1_ = 0;
  psVar2 = &writer.sourceMapUrl._M_string_length;
  writer.sourceMapUrl._M_dataplus._M_p = (pointer)0x0;
  writer.sourceMapUrl._M_string_length._0_1_ = 0;
  writer.options._1_1_ = 0;
  writer.options._0_1_ = options->emitBinary;
  local_c8[0] = (options->super_ToolOptions).passOptions.debugInfo;
  if (options->emitModuleNames == true) {
    writer.options._1_1_ = 1;
  }
  pcVar4 = (filename->_M_dataplus)._M_p;
  writer._16_8_ = psVar3;
  writer.symbolMap.field_2._8_8_ = psVar1;
  writer.sourceMapFilename.field_2._8_8_ = psVar2;
  writer.sourceMapUrl.field_2._8_8_ = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&writer.sourceMapUrl.field_2 + 8),pcVar4,
             pcVar4 + filename->_M_string_length);
  ::wasm::ModuleWriter::write(local_c8,wasm,(undefined1 *)((long)&writer.sourceMapUrl.field_2 + 8));
  if ((long *)writer.sourceMapUrl.field_2._8_8_ != local_40) {
    operator_delete((void *)writer.sourceMapUrl.field_2._8_8_,local_40[0] + 1);
  }
  if ((size_type *)writer.sourceMapFilename.field_2._8_8_ != psVar2) {
    operator_delete((void *)writer.sourceMapFilename.field_2._8_8_,
                    CONCAT71(writer.sourceMapUrl._M_string_length._1_7_,
                             (undefined1)writer.sourceMapUrl._M_string_length) + 1);
  }
  if ((size_type *)writer.symbolMap.field_2._8_8_ != psVar1) {
    operator_delete((void *)writer.symbolMap.field_2._8_8_,
                    CONCAT71(writer.sourceMapFilename._M_string_length._1_7_,
                             (undefined1)writer.sourceMapFilename._M_string_length) + 1);
  }
  if ((size_type *)writer._16_8_ != psVar3) {
    operator_delete((void *)writer._16_8_,
                    CONCAT71(writer.symbolMap._M_string_length._1_7_,
                             (undefined1)writer.symbolMap._M_string_length) + 1);
  }
  return;
}

Assistant:

void writeModule(Module& wasm,
                 std::string filename,
                 const WasmSplitOptions& options) {
  ModuleWriter writer(options.passOptions);
  writer.setBinary(options.emitBinary);
  writer.setDebugInfo(options.passOptions.debugInfo);
  if (options.emitModuleNames) {
    writer.setEmitModuleName(true);
  }
  writer.write(wasm, filename);
}